

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O2

char * zlib_level_strategy_name(int compression_level)

{
  char *pcVar1;
  
  pcVar1 = "";
  if ((compression_level != 0) && (zlib_strategy != 0)) {
    if (zlib_strategy == 2) {
      return "huffman ";
    }
    if (zlib_strategy != 3) {
      error_exit("bad strategy",zlib_strategy);
    }
    pcVar1 = "rle ";
  }
  return pcVar1;
}

Assistant:

const char* zlib_level_strategy_name(int compression_level) {
  if (compression_level == 0)
    return "";  // strategy is meaningless at level 0
  if (zlib_strategy == Z_HUFFMAN_ONLY)
    return "huffman ";
  if (zlib_strategy == Z_RLE)
    return "rle ";
  if (zlib_strategy == Z_DEFAULT_STRATEGY)
    return "";
  error_exit("bad strategy", zlib_strategy);
  return nullptr;
}